

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TypedArray.cpp
# Opt level: O0

List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *
Js::IteratorToList(RecyclableObject *iterator,ScriptContext *scriptContext,ArenaAllocator *alloc)

{
  code *pcVar1;
  bool bVar2;
  undefined4 *puVar3;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *this;
  RecyclableObject *nextFunc_00;
  RecyclableObject *nextFunc;
  List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer> *retList;
  Var nextValue;
  ArenaAllocator *alloc_local;
  ScriptContext *scriptContext_local;
  RecyclableObject *iterator_local;
  
  nextValue = alloc;
  alloc_local = (ArenaAllocator *)scriptContext;
  scriptContext_local = (ScriptContext *)iterator;
  if (iterator == (RecyclableObject *)0x0) {
    AssertCount = AssertCount + 1;
    Throw::LogAssert();
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 1;
    bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Library/TypedArray.cpp"
                                ,0xd4,"(iterator != nullptr)","iterator != nullptr");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    puVar3 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
    *puVar3 = 0;
  }
  this = JsUtil::List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>
         ::New((ArenaAllocator *)nextValue,4);
  nextFunc_00 = JavascriptOperators::CacheIteratorNext
                          ((RecyclableObject *)scriptContext_local,(ScriptContext *)alloc_local);
  while( true ) {
    bVar2 = JavascriptOperators::IteratorStepAndValue
                      ((RecyclableObject *)scriptContext_local,(ScriptContext *)alloc_local,
                       nextFunc_00,&retList);
    if (!bVar2) break;
    JsUtil::List<void_*,_Memory::ArenaAllocator,_false,_Js::CopyRemovePolicy,_DefaultComparer>::Add
              (this,&retList);
  }
  return this;
}

Assistant:

inline JsUtil::List<Var, ArenaAllocator>* IteratorToList(RecyclableObject *iterator, ScriptContext *scriptContext, ArenaAllocator *alloc)
    {
        Assert(iterator != nullptr);

        Var nextValue;
        JsUtil::List<Var, ArenaAllocator>* retList = JsUtil::List<Var, ArenaAllocator>::New(alloc);

        RecyclableObject* nextFunc = JavascriptOperators::CacheIteratorNext(iterator, scriptContext);
        while (JavascriptOperators::IteratorStepAndValue(iterator, scriptContext, nextFunc, &nextValue))
        {
            retList->Add(nextValue);
        }

        return retList;
    }